

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalBatchCopyToFile::GetData
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  CopyFunctionReturnType CVar1;
  pointer pGVar2;
  long lVar3;
  pointer this_00;
  type info;
  NotImplementedException *this_01;
  __pthread_list_t *this_02;
  vector<duckdb::Value,_true> file_list;
  Value local_c0;
  string fp;
  LogicalType local_60;
  vector<duckdb::Value,_true> local_48;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  if (this->use_tmp_file == true) {
    PhysicalCopyToFile::GetNonTmpFile(&fp,context->client,&this->file_path);
  }
  else {
    ::std::__cxx11::string::string((string *)&fp,(string *)&this->file_path);
  }
  CVar1 = this->return_type;
  if (CVar1 == WRITTEN_FILE_STATISTICS) {
    if (pGVar2[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __prev == (__pthread_internal_list *)0x0) goto LAB_009d2baa;
    this_02 = &pGVar2[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
               __list;
    this_00 = unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
              ::operator->((unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
                            *)this_02);
    ::std::__cxx11::string::operator=((string *)this_00,(string *)&fp);
    info = unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>::
           operator*((unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
                      *)this_02);
    PhysicalCopyToFile::ReturnStatistics(chunk,0,info);
  }
  else {
    if (CVar1 == CHANGED_ROWS_AND_FILE_LIST) {
      file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pGVar2[4].super_StateWithBlockableTasks.blocked_tasks.
          super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
          super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&file_list,&fp);
      }
      lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((unsigned_long)
                         pGVar2[4].super_StateWithBlockableTasks.blocked_tasks.
                         super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                         .
                         super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      Value::BIGINT(&local_c0,lVar3);
      DataChunk::SetValue(chunk,0,0,&local_c0);
      Value::~Value(&local_c0);
      LogicalType::LogicalType(&local_60,VARCHAR);
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start =
           file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish =
           file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      file_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::LIST(&local_c0,&local_60,&local_48);
      DataChunk::SetValue(chunk,1,0,&local_c0);
      Value::~Value(&local_c0);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
      LogicalType::~LogicalType(&local_60);
      chunk->count = 1;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&file_list);
      goto LAB_009d2baa;
    }
    if (CVar1 != CHANGED_ROWS) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_c0,"Unknown CopyFunctionReturnType",(allocator *)&file_list);
      NotImplementedException::NotImplementedException(this_01,(string *)&local_c0);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                      ((unsigned_long)
                       pGVar2[4].super_StateWithBlockableTasks.blocked_tasks.
                       super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       .
                       super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    Value::BIGINT(&local_c0,lVar3);
    DataChunk::SetValue(chunk,0,0,&local_c0);
    Value::~Value(&local_c0);
  }
  chunk->count = 1;
LAB_009d2baa:
  ::std::__cxx11::string::~string((string *)&fp);
  return FINISHED;
}

Assistant:

SourceResultType PhysicalBatchCopyToFile::GetData(ExecutionContext &context, DataChunk &chunk,
                                                  OperatorSourceInput &input) const {
	auto &g = sink_state->Cast<FixedBatchCopyGlobalState>();
	auto fp = use_tmp_file ? PhysicalCopyToFile::GetNonTmpFile(context.client, file_path) : file_path;
	switch (return_type) {
	case CopyFunctionReturnType::CHANGED_ROWS:
		chunk.SetValue(0, 0, Value::BIGINT(NumericCast<int64_t>(g.rows_copied.load())));
		chunk.SetCardinality(1);
		break;
	case CopyFunctionReturnType::CHANGED_ROWS_AND_FILE_LIST: {
		vector<Value> file_list;
		if (g.global_state) {
			file_list.emplace_back(std::move(fp));
		}
		chunk.SetValue(0, 0, Value::BIGINT(NumericCast<int64_t>(g.rows_copied.load())));
		chunk.SetValue(1, 0, Value::LIST(LogicalType::VARCHAR, std::move(file_list)));
		chunk.SetCardinality(1);
		break;
	}
	case CopyFunctionReturnType::WRITTEN_FILE_STATISTICS: {
		if (g.written_file_info) {
			g.written_file_info->file_path = std::move(fp);
			PhysicalCopyToFile::ReturnStatistics(chunk, 0, *g.written_file_info);
			chunk.SetCardinality(1);
		}
		break;
	}
	default:
		throw NotImplementedException("Unknown CopyFunctionReturnType");
	}

	return SourceResultType::FINISHED;
}